

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O3

void __thiscall Player::prepareForBattle(Player *this)

{
  bool bVar1;
  list<BlackCard_*,_std::allocator<BlackCard_*>_> *__x;
  ostream *poVar2;
  _Node *__tmp;
  _List_node_base *p_Var3;
  char ans;
  list<BlackCard_*,_std::allocator<BlackCard_*>_> arm;
  char local_49;
  _List_node_base local_48;
  
  __x = DynastyDeck::getDynDeck_abi_cxx11_(&this->army);
  std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::list
            ((list<BlackCard_*,_std::allocator<BlackCard_*>_> *)&local_48,__x);
  if (local_48._M_next != &local_48) {
    p_Var3 = local_48._M_next;
    do {
      bVar1 = BlackCard::isTapped((BlackCard *)p_Var3[1]._M_next);
      if (!bVar1) {
        BlackCard::PrintCardStats((BlackCard *)p_Var3[1]._M_next);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Do you want to use this personality?",0x24);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
        std::ostream::put(-8);
        poVar2 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"y for yes, n for no",0x13);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        std::operator>>((istream *)&std::cin,&local_49);
        if (local_49 == 'y') {
          BlackCard::setTapped((BlackCard *)p_Var3[1]._M_next,true);
        }
      }
      p_Var3 = p_Var3->_M_next;
    } while (p_Var3 != &local_48);
  }
  while (local_48._M_next != &local_48) {
    p_Var3 = (((_List_base<BlackCard_*,_std::allocator<BlackCard_*>_> *)&(local_48._M_next)->_M_next
              )->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(local_48._M_next,0x18);
    local_48._M_next = p_Var3;
  }
  return;
}

Assistant:

void Player::prepareForBattle()                                                 //activates any untapped personalities the player wants for attack
{
    char ans;

    list<BlackCard*> arm = army.getDynDeck();
    list<BlackCard*>::iterator it;

    for (it=arm.begin(); it!=arm.end(); it++)
    {
        if ((*it)->isTapped())                         //tapped means busy somewhere else
            continue;

        (*it)->PrintCardStats();
        cout << "Do you want to use this personality?"<<endl<<"y for yes, n for no"<<endl;
        cin >> ans;

        if (ans == 'y')
            (*it)->setTapped(true);             //every tapped personality will attack
    }
}